

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O2

TestStatus *
vkt::tessellation::anon_unknown_1::Barrier::test
          (TestStatus *__return_storage_ptr__,Context *context)

{
  pointer pfVar1;
  int i;
  long lVar2;
  vector<float,_std::allocator<float>_> vertexData;
  TextureLevel referenceImage;
  ConstPixelBufferAccess local_58;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&vertexData,0x20,(allocator_type *)&referenceImage);
  pfVar1 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar2] = (float)(int)lVar2 / 31.0;
  }
  tcu::TextureLevel::TextureLevel(&referenceImage);
  tcu::ImageIO::loadPNG
            (&referenceImage,context->m_testCtx->m_curArchive,
             "vulkan/data/tessellation/barrier_ref.png");
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_58,&referenceImage);
  runTest(__return_storage_ptr__,context,1,0x20,0x20,VK_FORMAT_R32_SFLOAT,
          vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start,
          (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1,&local_58);
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&vertexData.super__Vector_base<float,_std::allocator<float>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context)
{
	// Input vertex attribute data
	std::vector<float> vertexData		(NUM_VERTICES);
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	for (int i = 0; i < NUM_VERTICES; ++i)
		vertexData[i] = static_cast<float>(i) / (NUM_VERTICES - 1);

	tcu::TextureLevel referenceImage;
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), "vulkan/data/tessellation/barrier_ref.png");

	const int numPrimitives = 1;
	const int inPatchSize   = NUM_VERTICES;
	const int outPatchSize  = NUM_VERTICES;

	return runTest(context, numPrimitives, inPatchSize, outPatchSize,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}